

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O0

void __thiscall xr_entity_factory::xr_entity_factory(xr_entity_factory *this)

{
  EVP_PKEY_CTX *in_RSI;
  xr_entity_factory *this_local;
  
  this->m_system_ini = (xr_ini_file *)0x0;
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::vector(&this->m_clsids);
  init(this,in_RSI);
  return;
}

Assistant:

xr_entity_factory::xr_entity_factory(): m_system_ini(0)
{
	init();
}